

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightHandle __thiscall
pbrt::LightHandle::Create
          (LightHandle *this,string *name,ParameterDictionary *parameters,Transform *renderFromLight
          ,CameraTransform *cameraTransform,MediumHandle *outsideMedium,FileLoc *loc,Allocator alloc
          )

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uintptr_t iptr;
  PointLight *pPVar5;
  ProjectionLight *pPVar6;
  GoniometricLight *pGVar7;
  DistantLight *pDVar8;
  UniformInfiniteLight *pUVar9;
  RGBColorSpace *pRVar10;
  int iVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  ImageInfiniteLight *pIVar12;
  Transform *loc_00;
  long lVar14;
  uintptr_t iptr_1;
  ulong uVar15;
  DenselySampledSpectrum *pDVar16;
  pointer p;
  char *pcVar17;
  long lVar18;
  int x;
  Transform *args;
  Float FVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [56];
  float fVar23;
  Vector3f VVar24;
  Point3<float> PVar25;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Float local_3a0;
  allocator<char> local_399;
  float local_398;
  Float local_394;
  Allocator alloc_local;
  allocator<char> local_382;
  allocator<char> local_381;
  RGBColorSpace *colorSpace;
  Transform *local_378;
  Float local_370;
  Float local_36c;
  Float local_368;
  float local_364;
  ParameterDictionary *local_360;
  CameraTransform *local_358;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  WrapMode2D local_320;
  string filename;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> L;
  ImageChannelDesc channelDesc;
  Image image;
  SpectrumHandle local_208;
  ColorEncodingHandle local_200;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_1f8;
  SpectrumHandle local_1f0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1e8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1e0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1d8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1d0;
  ImageAndMetadata imageAndMetadata;
  
  (this->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = 0;
  alloc_local = alloc;
  loc_00 = renderFromLight;
  local_358 = cameraTransform;
  bVar3 = std::operator==(name,"point");
  if (bVar3) {
    local_1d0.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar5 = PointLight::Create(renderFromLight,(MediumHandle *)&local_1d0,parameters,
                                parameters->colorSpace,(FileLoc *)cameraTransform,alloc);
    uVar15 = (ulong)pPVar5 | 0x1000000000000;
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = uVar15;
  }
  else {
    local_378 = renderFromLight;
    bVar3 = std::operator==(name,"spot");
    if (bVar3) {
      local_1d8.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pPVar6 = (ProjectionLight *)
               SpotLight::Create(local_378,(MediumHandle *)&local_1d8,parameters,
                                 parameters->colorSpace,(FileLoc *)cameraTransform,alloc);
      uVar15 = 0x5000000000000;
LAB_003753c1:
      uVar15 = uVar15 | (ulong)pPVar6;
    }
    else {
      bVar3 = std::operator==(name,"goniometric");
      args = local_378;
      if (!bVar3) {
        bVar3 = std::operator==(name,"projection");
        if (bVar3) {
          local_1e8.bits =
               (outsideMedium->
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               ).bits;
          pPVar6 = ProjectionLight::Create(args,(MediumHandle *)&local_1e8,parameters,loc,alloc);
          uVar15 = 0x3000000000000;
          goto LAB_003753c1;
        }
        bVar3 = std::operator==(name,"distant");
        if (bVar3) {
          pDVar8 = DistantLight::Create
                             (args,parameters,parameters->colorSpace,(FileLoc *)loc_00,alloc);
          uVar15 = (ulong)pDVar8 | 0x2000000000000;
          goto LAB_0037540e;
        }
        bVar3 = std::operator==(name,"infinite");
        if (!bVar3) {
          pcVar17 = "%s: light type unknown.";
          goto LAB_00375bd6;
        }
        pRVar10 = parameters->colorSpace;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageAndMetadata,"L",(allocator<char> *)&image);
        ParameterDictionary::GetSpectrumArray
                  (&L,parameters,(string *)&imageAndMetadata,Illuminant,alloc_local);
        std::__cxx11::string::~string((string *)&imageAndMetadata);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageAndMetadata,"scale",(allocator<char> *)&image);
        local_398 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,1.0);
        std::__cxx11::string::~string((string *)&imageAndMetadata);
        local_3a0 = local_398;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageAndMetadata,"portal",(allocator<char> *)&image);
        ParameterDictionary::GetPoint3fArray(&portal,parameters,(string *)&imageAndMetadata);
        std::__cxx11::string::~string((string *)&imageAndMetadata);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&image,"filename",(allocator<char> *)&colorSpace);
        std::__cxx11::string::string<std::allocator<char>>((string *)&channelDesc,"",&local_399);
        ParameterDictionary::GetOneString
                  ((string *)&imageAndMetadata,parameters,(string *)&image,(string *)&channelDesc);
        ResolveFilename(&filename,(string *)&imageAndMetadata);
        std::__cxx11::string::~string((string *)&imageAndMetadata);
        std::__cxx11::string::~string((string *)&channelDesc);
        std::__cxx11::string::~string((string *)&image);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageAndMetadata,"illuminance",(allocator<char> *)&image);
        local_394 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,-1.0);
        std::__cxx11::string::~string((string *)&imageAndMetadata);
        if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (filename._M_string_length == 0) {
            pDVar16 = &pRVar10->illuminant;
            local_1f0.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                     )((ulong)pDVar16 | 0x2000000000000);
            FVar19 = SpectrumToPhotometric(&local_1f0);
            uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_394),1);
            bVar3 = (bool)((byte)uVar2 & 1);
            local_3a0 = (Float)((uint)bVar3 * (int)((local_394 / 3.1415927) * (local_3a0 / FVar19))
                               + (uint)!bVar3 * (int)(local_3a0 / FVar19));
            imageAndMetadata.image._0_8_ = pDVar16;
            pUVar9 = pstd::pmr::polymorphic_allocator<std::byte>::
                     new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                               (&alloc_local,args,(DenselySampledSpectrum **)&imageAndMetadata,
                                &local_3a0,&alloc_local);
            goto LAB_0037571d;
          }
          local_200.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          Image::Read(&imageAndMetadata,&filename,alloc_local,&local_200);
          colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
          local_360 = parameters;
          std::__cxx11::string::string<std::allocator<char>>((string *)&image,"R",&local_399);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&image.channelNames.nAlloc,"G",&local_381);
          std::__cxx11::string::string<std::allocator<char>>((string *)&image.p8.ptr,"B",&local_382)
          ;
          requestedChannels.n = 3;
          requestedChannels.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image::GetChannelDesc(&channelDesc,&imageAndMetadata.image,requestedChannels);
          parameters = local_360;
          lVar18 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&image.format + lVar18));
            lVar18 = lVar18 + -0x20;
          } while (lVar18 != -0x20);
          if (channelDesc.offset.nStored == 0) {
            ErrorExit<std::__cxx11::string&>
                      (loc,
                       "%s: image provided to \"infinite\" light must have R, G, and B channels.",
                       &filename);
          }
          local_208.
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                   )((ulong)&colorSpace->illuminant | 0x2000000000000);
          FVar19 = SpectrumToPhotometric(&local_208);
          local_3a0 = local_3a0 / FVar19;
          auVar21 = ZEXT864(0);
          if (0.0 < local_394) {
            pRVar10 = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
            local_370 = (pRVar10->XYZFromRGB).m[1][2];
            local_368 = (pRVar10->XYZFromRGB).m[1][0];
            local_36c = (pRVar10->XYZFromRGB).m[1][1];
            local_398 = 0.0;
            iVar4 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
            iVar13 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
            for (lVar18 = 0; lVar18 < iVar13; lVar18 = lVar18 + 1) {
              fVar23 = (float)iVar13;
              for (uVar15 = 0; (long)uVar15 < (long)iVar4; uVar15 = uVar15 + 1) {
                auVar20._0_4_ = ((float)(int)uVar15 + 0.5) / (float)iVar4;
                auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(((float)(int)lVar18 + 0.5) / fVar23))
                                        ,0x10);
                VVar24 = EqualAreaSquareToSphere((Point2f)auVar20._0_8_);
                local_364 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
                if (0.0 < local_364) {
                  WrapMode2D::WrapMode2D(&local_320,Clamp);
                  Image::GetChannels((ImageChannelValues *)&image,&imageAndMetadata.image,
                                     (Point2i)(lVar18 << 0x20 | uVar15),local_320);
                  pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)image._8_8_;
                  if (image._8_8_ == 0) {
                    pvVar11 = &image.channelNames;
                  }
                  lVar14 = 0;
                  while (lVar14 != 3) {
                    FVar19 = local_368;
                    if (((int)lVar14 != 0) && (FVar19 = local_36c, (int)lVar14 != 1)) {
                      FVar19 = local_370;
                    }
                    lVar1 = lVar14 * 4;
                    lVar14 = lVar14 + 1;
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)local_398),
                                              ZEXT416((uint)(FVar19 * *(float *)((long)&(pvVar11->
                                                                                        alloc).
                                                  memoryResource + lVar1))),ZEXT416((uint)local_364)
                                             );
                    local_398 = auVar20._0_4_;
                  }
                  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                            ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                             &image);
                }
                iVar4 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
                iVar13 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
              }
              args = local_378;
            }
            local_3a0 = (local_394 / ((6.2831855 / (float)(iVar13 * iVar4)) * local_398)) *
                        local_3a0;
            auVar21 = ZEXT464((uint)local_3a0);
            parameters = local_360;
          }
          Image::SelectChannels(&image,&imageAndMetadata.image,&channelDesc,alloc_local);
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pIVar12 = pstd::pmr::polymorphic_allocator<std::byte>::
                      new_object<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                                (&alloc_local,args,&image,&colorSpace,&local_3a0,&filename,
                                 &alloc_local);
            uVar15 = 0x8000000000000;
          }
          else {
            local_358 = (CameraTransform *)&local_358->worldFromRender;
            for (p = portal.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start; auVar22 = auVar21._8_56_,
                p != portal.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish; p = p + 1) {
              PVar25 = Transform::ApplyInverse<float>((Transform *)local_358,p);
              auVar21._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar21._8_56_ = auVar22;
              uVar2 = vmovlps_avx(auVar21._0_16_);
              (p->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar2;
              (p->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar2 >> 0x20);
              (p->super_Tuple3<pbrt::Point3,_float>).z = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
            }
            pIVar12 = (ImageInfiniteLight *)
                      pstd::pmr::polymorphic_allocator<std::byte>::
                      new_object<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                                (&alloc_local,args,&image,&colorSpace,&local_3a0,&filename,&portal,
                                 &alloc_local);
            uVar15 = 0x9000000000000;
          }
          uVar15 = (ulong)pIVar12 | uVar15;
          (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = uVar15;
          Image::~Image(&image);
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    (&channelDesc.offset);
          ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
        }
        else {
          if (filename._M_string_length != 0) {
            pcVar17 = "Can\'t specify both emission \"L\" and \"filename\" with ImageInfiniteLight";
LAB_00375c0f:
            ErrorExit(loc,pcVar17);
          }
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pcVar17 = "Portals are not supported for infinite lights without \"filename\".";
            goto LAB_00375c0f;
          }
          local_1f8.bits =
               ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start)->
               super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               ).bits;
          FVar19 = SpectrumToPhotometric((SpectrumHandle *)&local_1f8);
          uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)local_394),1);
          bVar3 = (bool)((byte)uVar2 & 1);
          local_3a0 = (Float)((uint)bVar3 * (int)((local_394 / 3.1415927) * (local_3a0 / FVar19)) +
                             (uint)!bVar3 * (int)(local_3a0 / FVar19));
          pUVar9 = pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                             (&alloc_local,args,
                              L.
                              super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_3a0,&alloc_local);
LAB_0037571d:
          uVar15 = (ulong)pUVar9 | 0x7000000000000;
          (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = uVar15;
        }
        std::__cxx11::string::~string((string *)&filename);
        std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
                  (&portal.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
        std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::
        ~_Vector_base(&L.
                       super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                     );
        goto LAB_0037541c;
      }
      local_1e0.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pGVar7 = GoniometricLight::Create
                         (local_378,(MediumHandle *)&local_1e0,parameters,parameters->colorSpace,loc
                          ,alloc);
      uVar15 = (ulong)pGVar7 | 0x4000000000000;
    }
LAB_0037540e:
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = uVar15;
  }
LAB_0037541c:
  if ((uVar15 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (LightHandle)
           (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            )this;
  }
  pcVar17 = "%s: unable to create light.";
LAB_00375bd6:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar17,name);
}

Assistant:

LightHandle LightHandle::Create(const std::string &name,
                                const ParameterDictionary &parameters,
                                const Transform &renderFromLight,
                                const CameraTransform &cameraTransform,
                                MediumHandle outsideMedium, const FileLoc *loc,
                                Allocator alloc) {
    LightHandle light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<SpectrumHandle> L =
            parameters.GetSpectrumArray("L", SpectrumType::Illuminant, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale, alloc);
        } else if (!L.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with ImageInfiniteLight");

            if (!portal.empty())
                ErrorExit(loc, "Portals are not supported for infinite lights "
                               "without \"filename\".");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale,
                                                           alloc);
        } else {
            ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc);
            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = 0; y < image.Resolution().y; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    for (int x = 0; x < image.Resolution().x; ++x) {
                        Float u = (x + 0.5f) / image.Resolution().x;
                        Vector3f w = EqualAreaSquareToSphere(Point2f(u, v));
                        // We could be more clever and see if we're in the inner rotated
                        // square, but not a big deal...
                        if (w.z <= 0)
                            continue;

                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c)
                            illuminance += values[c] * lum[c] * CosTheta(w);
                    }
                }
                illuminance *= 2 * Pi / (image.Resolution().x * image.Resolution().y);

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}